

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O0

long yyyymmdd(time_t date)

{
  tm *local_20;
  tm *lt;
  long datenum;
  time_t date_local;
  
  datenum = date;
  if (date == 0) {
    local_20 = getlt();
  }
  else {
    local_20 = (tm *)localtime(&datenum);
  }
  if (local_20->tm_year < 0x46) {
    lt = (tm *)((long)local_20->tm_year + 2000);
  }
  else {
    lt = (tm *)((long)local_20->tm_year + 0x76c);
  }
  return ((long)lt * 100 + (long)(local_20->tm_mon + 1)) * 100 + (long)local_20->tm_mday;
}

Assistant:

long yyyymmdd(time_t date)
{
	long datenum;
	struct tm *lt;

	if (date == 0)
		lt = getlt();
	else
		lt = localtime(&date);

	/* just in case somebody's localtime supplies (year % 100)
	   rather than the expected (year - 1900) */
	if (lt->tm_year < 70)
	    datenum = (long)lt->tm_year + 2000L;
	else
	    datenum = (long)lt->tm_year + 1900L;
	/* yyyy --> yyyymm */
	datenum = datenum * 100L + (long)(lt->tm_mon + 1);
	/* yyyymm --> yyyymmdd */
	datenum = datenum * 100L + (long)lt->tm_mday;
	return datenum;
}